

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O2

void __thiscall
vkt::ssbo::anon_unknown_0::BlockUnsizedStructArrayCase::BlockUnsizedStructArrayCase
          (BlockUnsizedStructArrayCase *this,TestContext *testCtx,char *name,char *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  ShaderInterface *this_00;
  vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_> *this_01;
  deUint32 dVar1;
  StructType *this_02;
  BufferBlock *this_03;
  int ndx;
  long lVar2;
  VarType VStack_98;
  Random rnd;
  VarType local_40;
  
  SSBOLayoutCase::SSBOLayoutCase
            (&this->super_SSBOLayoutCase,testCtx,name,"",layoutFlags,numInstances);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLayoutCase_00bd65c0;
  this->m_layoutFlags = (deUint32)description;
  this->m_numInstances = bufferMode;
  this_00 = &(this->super_SSBOLayoutCase).m_interface;
  this_02 = ShaderInterface::allocStruct(this_00,"S");
  glu::VarType::VarType((VarType *)&rnd,TYPE_UINT_VEC2,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"a",(VarType *)&rnd);
  glu::VarType::~VarType((VarType *)&rnd);
  glu::VarType::VarType(&VStack_98,TYPE_FLOAT_MAT2X4,PRECISION_MEDIUMP);
  glu::VarType::VarType((VarType *)&rnd,&VStack_98,4);
  glu::StructType::addMember(this_02,"b",(VarType *)&rnd);
  glu::VarType::~VarType((VarType *)&rnd);
  glu::VarType::~VarType(&VStack_98);
  glu::VarType::VarType((VarType *)&rnd,TYPE_FLOAT_VEC3,PRECISION_HIGHP);
  glu::StructType::addMember(this_02,"c",(VarType *)&rnd);
  glu::VarType::~VarType((VarType *)&rnd);
  this_03 = ShaderInterface::allocBlock(this_00,"Block");
  glu::VarType::VarType(&VStack_98,TYPE_FLOAT_VEC2,PRECISION_LOWP);
  BufferVar::BufferVar((BufferVar *)&rnd,"u",&VStack_98,0);
  this_01 = &this_03->m_variables;
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (this_01,(value_type *)&rnd);
  BufferVar::~BufferVar((BufferVar *)&rnd);
  glu::VarType::~VarType(&VStack_98);
  glu::VarType::VarType(&VStack_98,TYPE_UINT,PRECISION_MEDIUMP);
  BufferVar::BufferVar((BufferVar *)&rnd,"v",&VStack_98,0x400);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (this_01,(value_type *)&rnd);
  BufferVar::~BufferVar((BufferVar *)&rnd);
  glu::VarType::~VarType(&VStack_98);
  glu::VarType::VarType(&local_40,this_02);
  glu::VarType::VarType(&VStack_98,&local_40,-1);
  BufferVar::BufferVar((BufferVar *)&rnd,"s",&VStack_98,0x600);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (this_01,(value_type *)&rnd);
  BufferVar::~BufferVar((BufferVar *)&rnd);
  glu::VarType::~VarType(&VStack_98);
  glu::VarType::~VarType(&local_40);
  this_03->m_flags = this->m_layoutFlags;
  if (0 < this->m_numInstances) {
    std::__cxx11::string::assign((char *)&this_03->m_instanceName);
    BufferBlock::setArraySize(this_03,this->m_numInstances);
  }
  deRandom_init(&rnd.m_rnd,0xf6);
  for (lVar2 = 0; lVar2 < (int)(this->m_numInstances + (uint)(this->m_numInstances == 0));
      lVar2 = lVar2 + 1) {
    dVar1 = deRandom_getUint32(&rnd.m_rnd);
    (this_03->m_lastUnsizedArraySizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar2] = dVar1 % 5 + 1;
  }
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])
            (this);
  return;
}

Assistant:

BlockUnsizedStructArrayCase (tcu::TestContext& testCtx, const char* name, const char* description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
		, m_layoutFlags		(layoutFlags)
		, m_numInstances	(numInstances)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_UINT_VEC2, glu::PRECISION_HIGHP)); // \todo [pyry] UNUSED
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT2X4, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC3, glu::PRECISION_HIGHP));

		BufferBlock& block = m_interface.allocBlock("Block");
		block.addMember(BufferVar("u", VarType(glu::TYPE_FLOAT_VEC2, glu::PRECISION_LOWP), 0 /* no access */));
		block.addMember(BufferVar("v", VarType(glu::TYPE_UINT, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		block.addMember(BufferVar("s", VarType(VarType(&typeS), VarType::UNSIZED_ARRAY), ACCESS_READ|ACCESS_WRITE));
		block.setFlags(m_layoutFlags);

		if (m_numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(m_numInstances);
		}

		{
			de::Random rnd(246);
			for (int ndx = 0; ndx < (m_numInstances ? m_numInstances : 1); ndx++)
			{
				const int lastArrayLen = rnd.getInt(1, 5);
				block.setLastUnsizedArraySize(ndx, lastArrayLen);
			}
		}

		init();
	}